

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

InterfaceHandle __thiscall
helics::CommonCore::registerInput
          (CommonCore *this,LocalFederateId federateID,string_view key,string_view type,
          string_view units)

{
  ushort flags;
  InterfaceHandle handle;
  char *pcVar1;
  size_t sVar2;
  string_view message;
  string_view name;
  FederateState *this_00;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *p_Var3;
  byte *__src;
  size_t size;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar4;
  string_view fmt;
  format_args args;
  ActionMessage reg;
  undefined1 local_100 [64];
  SmallBuffer local_c0;
  byte *local_48;
  size_t local_40;
  
  __src = (byte *)key._M_str;
  size = key._M_len;
  this_00 = checkNewInterface(this,federateID,key,INPUT);
  p_Var3 = createBasicHandle(this,(GlobalFederateId)(this_00->global_id)._M_i.gid,
                             (LocalFederateId)(this_00->local_id).fid,INPUT,key,type,units,
                             (this_00->interfaceFlags).super___atomic_base<unsigned_short>._M_i);
  handle.hid = *(BaseType *)((long)&(p_Var3->super__Hash_node_base)._M_nxt + 4);
  flags = (this_00->interfaceFlags).super___atomic_base<unsigned_short>._M_i;
  aVar4._2_6_ = 0;
  aVar4._0_2_ = flags;
  FederateState::createInterface(this_00,INPUT,handle,key,type,units,flags);
  if (0xb < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
    pcVar1 = (this_00->name)._M_dataplus._M_p;
    sVar2 = (this_00->name)._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x14;
    args.field_1.args_ = aVar4.args_;
    args.desc_ = (unsigned_long_long)&local_48;
    local_48 = __src;
    local_40 = size;
    ::fmt::v11::vformat_abi_cxx11_((string *)local_100,(v11 *)"registering Input {}",fmt,args);
    message._M_len._4_4_ = local_100._12_4_;
    message._M_len._0_4_ = local_100._8_4_;
    name._M_str = pcVar1;
    name._M_len = sVar2;
    message._M_str = (char *)local_100._0_8_;
    BrokerBase::sendToLogger(&this->super_BrokerBase,(GlobalFederateId)0x0,0xc,name,message,false);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
  }
  ActionMessage::ActionMessage((ActionMessage *)local_100,cmd_reg_input);
  local_100._8_4_ = (this_00->global_id)._M_i.gid;
  local_100._26_2_ =
       *(undefined2 *)
        ((long)&(p_Var3->
                super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                ).
                super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                ._M_storage._M_storage + 6);
  local_100._12_4_ = handle.hid;
  local_c0.bufferSize = size;
  if ((local_c0.heap != __src) && (SmallBuffer::reserve(&local_c0,size), size != 0)) {
    memcpy(local_c0.heap,__src,size);
  }
  ActionMessage::setStringData((ActionMessage *)local_100,type,units);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(&(this->super_BrokerBase).actionQueue,(ActionMessage *)local_100);
  ActionMessage::~ActionMessage((ActionMessage *)local_100);
  return (InterfaceHandle)handle.hid;
}

Assistant:

InterfaceHandle CommonCore::registerInput(LocalFederateId federateID,
                                          std::string_view key,
                                          std::string_view type,
                                          std::string_view units)
{
    auto* fed = checkNewInterface(federateID, key, InterfaceType::INPUT);
    const auto& handle = createBasicHandle(fed->global_id,
                                           fed->local_id,
                                           InterfaceType::INPUT,
                                           key,
                                           type,
                                           units,
                                           fed->getInterfaceFlags());

    auto hid = handle.getInterfaceHandle();
    fed->createInterface(InterfaceType::INPUT, hid, key, type, units, fed->getInterfaceFlags());

    LOG_INTERFACES(parent_broker_id,
                   fed->getIdentifier(),
                   fmt::format("registering Input {}", key));
    ActionMessage reg(CMD_REG_INPUT);
    reg.source_id = fed->global_id.load();
    reg.source_handle = hid;
    reg.flags = handle.flags;
    reg.name(key);
    reg.setStringData(type, units);

    actionQueue.push(std::move(reg));
    return hid;
}